

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

uint64_t __thiscall helics::FederateState::getQueueSize(FederateState *this)

{
  shared_mutex *__rwlock;
  pointer puVar1;
  int32_t iVar2;
  uint64_t uVar3;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *end_point;
  pointer puVar4;
  
  __rwlock = &(this->interfaceInformation).endpoints.m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  puVar1 = *(pointer *)
            ((long)&(this->interfaceInformation).endpoints.m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  uVar3 = 0;
  for (puVar4 = (this->interfaceInformation).endpoints.m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    iVar2 = EndpointInfo::availableMessages
                      ((puVar4->_M_t).
                       super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                       .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl);
    uVar3 = uVar3 + (long)iVar2;
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return uVar3;
}

Assistant:

uint64_t FederateState::getQueueSize() const
{
    uint64_t cnt = 0;
    for (const auto& end_point : interfaceInformation.getEndpoints()) {
        cnt += end_point->availableMessages();
    }
    return cnt;
}